

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::Array2D<pbrt::RGBFilm::Pixel>::Array2D
          (Array2D<pbrt::RGBFilm::Pixel> *this,Bounds2i *extent,Allocator allocator)

{
  Pixel *pPVar1;
  double *pdVar2;
  Pixel *pPVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  TVar4 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar4;
  (this->allocator).memoryResource = allocator.memoryResource;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  auVar11 = vpsubd_avx(auVar10,auVar11);
  auVar10 = vpshufd_avx(auVar11,0x55);
  auVar10 = vpmulld_avx(auVar10,auVar11);
  uVar9 = auVar10._0_4_;
  if (uVar9 == 0) {
    this->values = (Pixel *)0x0;
  }
  else {
    iVar5 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                      (allocator.memoryResource,(long)(int)uVar9 * 0x38,8);
    this->values = (Pixel *)CONCAT44(extraout_var,iVar5);
    if (0 < (int)uVar9) {
      lVar6 = 0x20;
      uVar7 = 0;
      do {
        pPVar3 = this->values;
        pdVar2 = &pPVar3[uVar7].weightSum;
        *pdVar2 = 0.0;
        (((AtomicDouble *)(pdVar2 + 1))->bits).super___atomic_base<unsigned_long>._M_i = 0;
        (((AtomicDouble *)(pdVar2 + 2))->bits).super___atomic_base<unsigned_long>._M_i = 0;
        (((AtomicDouble *)(pdVar2 + 3))->bits).super___atomic_base<unsigned_long>._M_i = 0;
        pPVar1 = pPVar3 + uVar7;
        pPVar1->rgbSum[0] = 0.0;
        pPVar1->rgbSum[1] = 0.0;
        pPVar1->rgbSum[2] = 0.0;
        pPVar1->weightSum = 0.0;
        lVar8 = -0x18;
        do {
          LOCK();
          *(undefined8 *)((long)(pPVar3->splatRGB + -1) + lVar8 + lVar6) = 0;
          UNLOCK();
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0);
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x38;
      } while (uVar7 != uVar9);
    }
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, Allocator allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }